

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Account.cpp
# Opt level: O0

void __thiscall Account::Account(Account *this)

{
  Account *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_characters);
  std::__cxx11::string::operator=((string *)this,"");
  this->_password = 0;
  this->_account_level = 2;
  return;
}

Assistant:

Account::Account() {
    _username = "";
    _password = 0;
    _account_level = NORMAL;
}